

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_easy_api.cc
# Opt level: O1

bool __thiscall ModelBuilder::Check(ModelBuilder *this,NLSolution *sol)

{
  double dVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = ABS(this->obj_val_ref_) + ABS(sol->obj_val_);
  if (1.0 <= dVar5) {
    dVar5 = 1.0;
  }
  if (ABS(sol->obj_val_ - this->obj_val_ref_) <= dVar5 * 1e-05) {
    pdVar2 = (sol->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = ((long)(sol->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) + 1;
    do {
      lVar4 = lVar3;
      if (lVar4 == 1) goto LAB_00104886;
      dVar5 = (this->x_ref_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4 + -2];
      dVar1 = pdVar2[lVar4 + -2];
      dVar6 = ABS(dVar1) + ABS(dVar5);
      if (1.0 <= dVar6) {
        dVar6 = 1.0;
      }
      lVar3 = lVar4 + -1;
    } while (ABS(dVar5 - dVar1) <= dVar6 * 1e-05);
    printf("MIQP 1: wrong x[%ld] (%.17g !~ %.17g)\n");
    if (lVar4 == 1) {
LAB_00104886:
      printf("MIQP 1: solution check ok, obj=%.17g.\n",sol->obj_val_);
      return true;
    }
  }
  else {
    printf("MIQP 1: wrong obj val (%.17g !~ %.17g)\n");
  }
  return false;
}

Assistant:

bool Check(mp::NLSolution sol) {
    if (!ApproxEqual(sol.obj_val_, obj_val_ref_)) {
      printf("MIQP 1: wrong obj val (%.17g !~ %.17g)\n",
             sol.obj_val_, obj_val_ref_);
      return false;
    }
    for (auto i=sol.x_.size(); i--; )
      if (!ApproxEqual(x_ref_[i], sol.x_[i])) {
        printf("MIQP 1: wrong x[%ld] (%.17g !~ %.17g)\n",
               i+1, sol.x_[i], x_ref_[i]);
        return false;
      }
    printf("MIQP 1: solution check ok, obj=%.17g.\n",
           sol.obj_val_);
    return true;
  }